

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

Constraint *
slang::ast::ConditionalConstraint::fromSyntax
          (ConditionalConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ASTContext *pAVar4;
  InvalidConstraint *pIVar5;
  socklen_t __len;
  socklen_t __len_00;
  ConstraintExprVisitor *args_00;
  Constraint *elseBody;
  Constraint *local_48;
  ConstraintExprVisitor local_40;
  Expression *args;
  
  this = ((context->scope).ptr)->compilation;
  iVar2 = Expression::bind((int)(syntax->condition).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  iVar2 = Constraint::bind((int)(syntax->constraints).ptr,(sockaddr *)context,__len);
  local_48 = (Constraint *)0x0;
  if (syntax->elseClause != (ElseConstraintClauseSyntax *)0x0) {
    iVar3 = Constraint::bind((int)(syntax->elseClause->constraints).ptr,(sockaddr *)context,__len_00
                            );
    local_48 = (Constraint *)CONCAT44(extraout_var_01,iVar3);
  }
  pAVar4 = (ASTContext *)
           BumpAllocator::
           emplace<slang::ast::ConditionalConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&,slang::ast::Constraint_const*&>
                     (&this->super_BumpAllocator,args,(Constraint *)CONCAT44(extraout_var_00,iVar2),
                      &local_48);
  bVar1 = Expression::bad(args);
  if (((bVar1) || (((Constraint *)CONCAT44(extraout_var_00,iVar2))->kind == Invalid)) ||
     ((local_48 != (Constraint *)0x0 && (local_48->kind == Invalid)))) {
    args_00 = &local_40;
  }
  else {
    local_40.failed = false;
    local_40.isTop = true;
    local_40.sawRandVars = false;
    local_40.isSoft = false;
    local_40.context = context;
    bVar1 = Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                      (args,args,&local_40);
    if ((bVar1) && (bVar1 = ASTContext::requireBooleanConvertible(context,args), bVar1)) {
      return (Constraint *)pAVar4;
    }
    args_00 = (ConstraintExprVisitor *)&stack0xffffffffffffffd0;
  }
  args_00->context = pAVar4;
  pIVar5 = BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
                     (&this->super_BumpAllocator,(Constraint **)args_00);
  return &pIVar5->super_Constraint;
}

Assistant:

Constraint& ConditionalConstraint::fromSyntax(const ConditionalConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.condition, context);
    auto& ifBody = Constraint::bind(*syntax.constraints, context);

    const Constraint* elseBody = nullptr;
    if (syntax.elseClause)
        elseBody = &Constraint::bind(*syntax.elseClause->constraints, context);

    auto result = comp.emplace<ConditionalConstraint>(pred, ifBody, elseBody);
    if (pred.bad() || ifBody.bad() || (elseBody && elseBody->bad()))
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor) || !context.requireBooleanConvertible(pred))
        return badConstraint(comp, result);

    return *result;
}